

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

RealisticCamera *
pbrt::RealisticCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,FilmHandle *film,
          MediumHandle *medium,FileLoc *loc,Allocator alloc)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Point2i resolution;
  size_t sVar6;
  int i_1;
  int iVar7;
  int iVar8;
  memory_resource *pmVar9;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar10;
  long *plVar11;
  RealisticCamera *p;
  size_t sVar12;
  long *plVar13;
  Point2i resolution_00;
  int i;
  _Alloc_hider _Var14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  Point2i PVar19;
  long lVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  float fVar23;
  Float FVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined4 in_XMM2_Da;
  undefined1 in_register_00001284 [12];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_pbrt::Point2<float>_> vert;
  span<const_pbrt::Point2<float>_> vert_00;
  int builtinRes;
  Float focusDistance;
  Float apertureDiameter;
  string apertureName;
  vector<float,_std::allocator<float>_> lensParameters;
  string lensFile;
  anon_class_16_2_5a488c63 rasterize;
  Image apertureImage;
  Image mono;
  string ret;
  ImageChannelDesc rgbDesc;
  CameraBaseParameters cameraBaseParameters;
  polymorphic_allocator<std::byte> local_900;
  undefined1 local_8f8 [16];
  long local_8e0;
  int local_8d8;
  float local_8d4;
  Float local_8d0;
  Float local_8cc;
  string local_8c8;
  ImageChannelValues local_8a8;
  vector<float,_std::allocator<float>_> local_878;
  string local_860;
  anon_class_16_2_5a488c63 local_840;
  undefined1 local_830 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_820;
  ColorEncodingHandle local_780;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_778;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_758;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_738;
  undefined1 local_718 [32];
  undefined1 auStack_6f8 [32];
  long alStack_6d8 [2];
  long local_6c8 [26];
  undefined1 local_5f8 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_548;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_540;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_520;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_500 [9];
  ColorEncodingHandle local_3e0;
  ColorEncodingHandle local_3d8;
  ColorEncodingHandle local_3d0;
  ColorEncodingHandle local_3c8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_3c0;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_3b8;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_3b0;
  CameraBaseParameters local_380;
  undefined4 extraout_var;
  
  local_3b8.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  local_3c0.bits =
       (medium->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_900.memoryResource = alloc.memoryResource;
  CameraBaseParameters::CameraBaseParameters
            (&local_380,cameraTransform,(FilmHandle *)&local_3b8,(MediumHandle *)&local_3c0,
             parameters,loc);
  local_830._0_8_ = &local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"lensfile","");
  pcVar1 = local_718 + 0x10;
  local_718._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"");
  ParameterDictionary::GetOneString
            ((string *)local_5f8,parameters,(string *)local_830,(string *)local_718);
  ResolveFilename(&local_860,(string *)local_5f8);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_5f8._0_8_ != &local_5e8) {
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                             local_5e8.alloc.memoryResource._0_1_) + 1);
  }
  if ((pointer)local_718._0_8_ != pcVar1) {
    operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
  }
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_830._0_8_ != &local_820) {
    operator_delete((void *)local_830._0_8_,(ulong)((long)local_820.alloc.memoryResource + 1));
  }
  local_5f8._0_8_ = &local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"aperturediameter","");
  local_8cc = ParameterDictionary::GetOneFloat(parameters,(string *)local_5f8,1.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_5f8._0_8_ != &local_5e8) {
    local_8f8._0_4_ = local_8cc;
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                             local_5e8.alloc.memoryResource._0_1_) + 1);
    local_8cc = (Float)local_8f8._0_4_;
  }
  local_5f8._0_8_ = &local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"focusdistance","");
  local_8d0 = ParameterDictionary::GetOneFloat(parameters,(string *)local_5f8,10.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_5f8._0_8_ != &local_5e8) {
    local_8f8._0_4_ = local_8d0;
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                             local_5e8.alloc.memoryResource._0_1_) + 1);
    local_8d0 = (Float)local_8f8._0_4_;
  }
  if (local_860._M_string_length == 0) {
    Error(loc,"No lens description file supplied!");
    p = (RealisticCamera *)0x0;
    goto LAB_00354123;
  }
  ReadFloatFile(&local_878,&local_860);
  if (local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_5f8._8_8_ = 0;
    local_5e8.alloc.memoryResource._0_1_ = '\0';
    local_5f8._0_8_ = &local_5e8;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)local_5f8,"Error reading lens specification file \"%s\".",&local_860);
    Error(loc,(char *)local_5f8._0_8_);
LAB_003540e6:
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_5f8._0_8_ != &local_5e8) {
      operator_delete((void *)local_5f8._0_8_,
                      CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                               local_5e8.alloc.memoryResource._0_1_) + 1);
    }
    p = (RealisticCamera *)0x0;
  }
  else {
    if (((long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start & 0xcU) != 0) {
      local_830._0_4_ =
           (undefined4)
           ((ulong)((long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      local_5f8._8_8_ = 0;
      local_5e8.alloc.memoryResource._0_1_ = '\0';
      local_5f8._0_8_ = &local_5e8;
      detail::stringPrintfRecursive<std::__cxx11::string&,int>
                ((string *)local_5f8,
                 "%s: excess values in lens specification file; must be multiple-of-four values, read %d."
                 ,&local_860,(int *)local_830);
      Error(loc,(char *)local_5f8._0_8_);
      goto LAB_003540e6;
    }
    local_840.builtinRes = &local_8d8;
    local_8d8 = 0x100;
    local_840.alloc = &local_900;
    local_830._0_8_ = &local_820;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"aperture","");
    local_718._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"");
    ParameterDictionary::GetOneString
              ((string *)local_5f8,parameters,(string *)local_830,(string *)local_718);
    ResolveFilename(&local_8c8,(string *)local_5f8);
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_5f8._0_8_ != &local_5e8) {
      operator_delete((void *)local_5f8._0_8_,
                      CONCAT71(local_5e8.alloc.memoryResource._1_7_,
                               local_5e8.alloc.memoryResource._0_1_) + 1);
    }
    if ((pointer)local_718._0_8_ != pcVar1) {
      operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_830._0_8_ != &local_820) {
      operator_delete((void *)local_830._0_8_,(ulong)((long)local_820.alloc.memoryResource + 1));
    }
    pmVar9 = pstd::pmr::new_delete_resource();
    local_830._0_4_ = U256;
    local_830._4_4_ = 0;
    local_830._8_4_ = 0;
    local_820.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_820.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_820.nAlloc = 0;
    local_820.nStored = 0;
    local_780.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    local_778.ptr = (uchar *)0x0;
    local_778.nAlloc = 0;
    local_778.nStored = 0;
    local_758.ptr = (Half *)0x0;
    local_758.nAlloc = 0;
    local_758.nStored = 0;
    local_738.ptr = (float *)0x0;
    local_738.nAlloc = 0;
    local_738.nStored = 0;
    local_778.alloc.memoryResource = pmVar9;
    local_758.alloc.memoryResource = pmVar9;
    local_738.alloc.memoryResource = pmVar9;
    if (local_8c8._M_string_length != 0) {
      iVar7 = std::__cxx11::string::compare((char *)&local_8c8);
      iVar8 = local_8d8;
      if (iVar7 == 0) {
        local_718._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"Y","");
        local_3c8.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        PVar19.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
        PVar19.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
        channels_00.n = 1;
        channels_00.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
        Image::Image((Image *)local_5f8,Float,PVar19,channels_00,&local_3c8,
                     (Allocator)local_900.memoryResource);
        local_830._8_4_ = local_5f8._8_4_;
        local_830._0_4_ = (undefined4)local_5f8._0_8_;
        local_830._4_4_ = SUB84(local_5f8._0_8_,4);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_820,&local_5e8);
        local_780.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )local_548.bits;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&local_778,&local_540);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  (&local_758,&local_520);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_738,local_500);
        local_500[0].nStored = 0;
        (*(local_500[0].alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_500[0].alloc.memoryResource,local_500[0].ptr,local_500[0].nAlloc << 2,4);
        local_520.nStored = 0;
        (*(local_520.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_520.alloc.memoryResource,local_520.ptr,local_520.nAlloc * 2,2);
        local_540.nStored = 0;
        (*(local_540.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_540.alloc.memoryResource,local_540.ptr,local_540.nAlloc,1);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&local_5e8);
        if ((pointer)local_718._0_8_ != pcVar1) {
          operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
        }
        if (0 < (int)local_830._8_4_) {
          lVar20 = 0;
          lVar18 = 0;
          do {
            if (0 < (int)local_830._4_4_) {
              fVar23 = (float)(int)lVar18 + 0.5;
              local_8f8 = ZEXT416((uint)(fVar23 + fVar23));
              lVar16 = 0;
              do {
                fVar23 = (float)(int)lVar16 + 0.5;
                auVar3 = vinsertps_avx(ZEXT416((uint)(fVar23 + fVar23)),
                                       ZEXT416((uint)local_8f8._0_4_),0x10);
                auVar22 = vpinsrd_avx(ZEXT416((uint)local_830._4_4_),local_830._8_4_,1);
                auVar22 = vcvtdq2ps_avx(auVar22);
                auVar22 = vdivps_avx(auVar3,auVar22);
                auVar3._8_4_ = 0xbf800000;
                auVar3._0_8_ = 0xbf800000bf800000;
                auVar3._12_4_ = 0xbf800000;
                auVar22 = vaddps_avx512vl(auVar22,auVar3);
                auVar25._0_4_ = auVar22._0_4_ * auVar22._0_4_;
                auVar25._4_4_ = auVar22._4_4_ * auVar22._4_4_;
                auVar25._8_4_ = auVar22._8_4_ * auVar22._8_4_;
                auVar25._12_4_ = auVar22._12_4_ * auVar22._12_4_;
                auVar22 = vhaddps_avx(auVar25,auVar25);
                auVar4._8_4_ = 0x80000000;
                auVar4._0_8_ = 0x8000000080000000;
                auVar4._12_4_ = 0x80000000;
                auVar22 = vxorps_avx512vl(auVar22,auVar4);
                fVar23 = expf(auVar22._0_4_);
                auVar22 = vmaxss_avx(ZEXT416((uint)(fVar23 + -0.36787945)),ZEXT416(0));
                Image::SetChannel((Image *)local_830,(Point2i)(lVar20 + lVar16),0,auVar22._0_4_);
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)local_830._4_4_);
            }
            lVar18 = lVar18 + 1;
            lVar20 = lVar20 + 0x100000000;
          } while (lVar18 < (int)local_830._8_4_);
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_8c8);
        iVar8 = local_8d8;
        if (iVar7 == 0) {
          local_718._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"Y","");
          local_3d0.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          resolution_00.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
          resolution_00.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
          channels_01.n = 1;
          channels_01.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
          Image::Image((Image *)local_5f8,Float,resolution_00,channels_01,&local_3d0,
                       (Allocator)local_900.memoryResource);
          Image::operator=((Image *)local_830,(Image *)local_5f8);
          Image::~Image((Image *)local_5f8);
          if ((pointer)local_718._0_8_ != pcVar1) {
            operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
          }
          if (0 < (int)local_830._8_4_) {
            lVar20 = 0;
            lVar18 = 0;
            do {
              if (0 < (int)local_830._4_4_) {
                lVar16 = 0;
                do {
                  Image::SetChannel((Image *)local_830,(Point2i)(lVar20 + lVar16),0,1.0);
                  lVar16 = lVar16 + 1;
                } while (lVar16 < (int)local_830._4_4_);
              }
              lVar18 = lVar18 + 1;
              lVar20 = lVar20 + 0x100000000;
            } while (lVar18 < (int)local_830._8_4_);
          }
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&local_8c8);
          if (iVar8 == 0) {
            local_718._0_8_ = (pointer)0x3f80000000000000;
            local_718._8_8_ = 0x3e9e377a3f737870;
            local_718._16_8_ = 0xbf4f1bbd3f167918;
            local_718._24_8_ = 0xbf4f1bbdbf167918;
            auStack_6f8._0_8_ = (pointer)0x3e9e377abf737870;
            lVar18 = 0;
            do {
              auVar22._0_4_ = (float)*(undefined8 *)(local_718 + lVar18 * 8) * 0.8;
              auVar22._4_4_ = (float)((ulong)*(undefined8 *)(local_718 + lVar18 * 8) >> 0x20) * 0.8;
              auVar22._8_8_ = 0;
              uVar2 = vmovlps_avx(auVar22);
              *(undefined8 *)(local_718 + lVar18 * 8) = uVar2;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 5);
            vert.n = 5;
            vert.ptr = (Point2<float> *)local_718;
            Create::anon_class_16_2_5a488c63::operator()((Image *)local_5f8,&local_840,vert);
            Image::operator=((Image *)local_830,(Image *)local_5f8);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_8c8);
            if (iVar8 != 0) {
              local_3d8.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                       )0;
              Image::Read((ImageAndMetadata *)local_5f8,&local_8c8,
                          (Allocator)local_900.memoryResource,&local_3d8);
              Image::operator=((Image *)local_830,(Image *)local_5f8);
              if (1 < (int)local_820.nStored) {
                local_718._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"R","");
                auStack_6f8._0_8_ = auStack_6f8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"G","");
                _Var14._M_p = (pointer)local_6c8;
                alStack_6d8[0] = (long)_Var14._M_p;
                std::__cxx11::string::_M_construct<char_const*>((string *)alStack_6d8,"B","");
                requestedChannels.n = 3;
                requestedChannels.ptr =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718;
                Image::GetChannelDesc
                          ((ImageChannelDesc *)&local_3b0,(Image *)local_830,requestedChannels);
                lVar18 = -0x60;
                do {
                  if ((long *)_Var14._M_p != *(long **)((long)_Var14._M_p + -0x10)) {
                    operator_delete(*(long **)((long)_Var14._M_p + -0x10),*(long *)_Var14._M_p + 1);
                  }
                  _Var14._M_p = _Var14._M_p + -0x20;
                  lVar18 = lVar18 + 0x20;
                } while (lVar18 != 0);
                if (local_3b0.nStored == 0) {
                  ErrorExit<std::__cxx11::string&>
                            ("%s: didn\'t find R, G, B channels to average for aperture image.",
                             &local_8c8);
                }
                resolution.super_Tuple2<pbrt::Point2,_int>.y = local_830._8_4_;
                resolution.super_Tuple2<pbrt::Point2,_int>.x = local_830._4_4_;
                local_8a8.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                alloc.memoryResource =
                     (memory_resource *)
                     &local_8a8.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"Y","");
                local_3e0.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                         )0;
                channels.n = 1;
                channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_8a8;
                Image::Image((Image *)local_718,Float,resolution,channels,&local_3e0,
                             (Allocator)local_900.memoryResource);
                if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)local_8a8.
                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc
                       .memoryResource !=
                    &local_8a8.
                     super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2
                   ) {
                  operator_delete(local_8a8.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .alloc.memoryResource,
                                  local_8a8.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .field_2._0_8_ + 1);
                }
                if (0 < (int)local_718._8_4_) {
                  local_8e0 = 0;
                  do {
                    if (0 < (int)local_718._4_4_) {
                      uVar15 = local_8e0 << 0x20;
                      uVar17 = 0;
                      do {
                        PVar19.super_Tuple2<pbrt::Point2,_int> =
                             (Tuple2<pbrt::Point2,_int>)(uVar15 | uVar17);
                        Image::GetChannels(&local_8a8,(Image *)local_830,PVar19,
                                           (ImageChannelDesc *)&local_3b0,(WrapMode2D)0x200000002);
                        sVar6 = local_8a8.
                                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                .nStored;
                        if (local_8a8.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            nStored == 0) {
                          fVar23 = 0.0;
                        }
                        else {
                          paVar10 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)local_8a8.
                                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       .ptr;
                          if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                               *)local_8a8.
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .ptr ==
                              (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                               *)0x0) {
                            paVar10 = &local_8a8.
                                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       .field_2;
                          }
                          fVar23 = 0.0;
                          sVar12 = 0;
                          do {
                            fVar23 = fVar23 + paVar10->fixed[sVar12];
                            sVar12 = sVar12 + 1;
                          } while (local_8a8.
                                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   .nStored != sVar12);
                        }
                        local_8f8._0_4_ = fVar23;
                        local_8a8.
                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        nStored = 0;
                        (**(code **)(*(long *)local_8a8.
                                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                              .alloc.memoryResource + 0x18))
                                  (local_8a8.
                                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   .alloc.memoryResource,
                                   local_8a8.
                                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   .ptr,local_8a8.
                                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                        .nAlloc << 2,4);
                        auVar5._4_12_ = in_register_00001284;
                        auVar5._0_4_ = in_XMM2_Da;
                        auVar22 = vcvtusi2ss_avx512f(auVar5,sVar6);
                        Image::SetChannel((Image *)local_718,PVar19,0,
                                          (float)local_8f8._0_4_ / auVar22._0_4_);
                        uVar17 = uVar17 + 1;
                      } while ((long)uVar17 < (long)(int)local_718._4_4_);
                    }
                    local_8e0 = local_8e0 + 1;
                  } while (local_8e0 < (int)local_718._8_4_);
                }
                Image::operator=((Image *)local_830,(Image *)local_718);
                Image::~Image((Image *)local_718);
                InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                          (&local_3b0);
              }
              ImageAndMetadata::~ImageAndMetadata((ImageAndMetadata *)local_5f8);
              goto LAB_00354b5e;
            }
            alStack_6d8[0] = 0;
            alStack_6d8[1] = 0;
            local_718._0_8_ = (pointer)0x0;
            local_718._8_8_ = 0;
            local_718._16_8_ = 0;
            local_718._24_8_ = 0;
            auStack_6f8._0_8_ = (pointer)0x0;
            auStack_6f8._8_8_ = 0;
            auStack_6f8._16_8_ = 0;
            auStack_6f8._24_8_ = 0;
            uVar15 = 0;
            do {
              local_8f8._0_4_ = *(undefined4 *)(&DAT_005dc820 + (ulong)((uVar15 & 1) == 0) * 4);
              local_8d4 = ((float)(int)uVar15 * 3.1415927) / 5.0;
              fVar23 = cosf(local_8d4);
              local_8e0 = CONCAT44(local_8e0._4_4_,fVar23 * (float)local_8f8._0_4_);
              fVar23 = sinf(local_8d4);
              *(undefined4 *)(local_718 + uVar15 * 8) = (undefined4)local_8e0;
              *(float *)(local_718 + uVar15 * 8 + 4) = fVar23 * (float)local_8f8._0_4_;
              uVar15 = uVar15 + 1;
            } while (uVar15 != 10);
            plVar11 = alStack_6d8 + 1;
            plVar13 = (long *)(local_718 + 8);
            do {
              lVar18 = plVar13[-1];
              plVar13[-1] = *plVar11;
              *plVar11 = lVar18;
              plVar11 = plVar11 + -1;
              bVar21 = plVar13 < plVar11;
              plVar13 = plVar13 + 1;
            } while (bVar21);
            vert_00.n = 10;
            vert_00.ptr = (Point2<float> *)local_718;
            Create::anon_class_16_2_5a488c63::operator()((Image *)local_5f8,&local_840,vert_00);
            Image::operator=((Image *)local_830,(Image *)local_5f8);
          }
          Image::~Image((Image *)local_5f8);
        }
      }
LAB_00354b5e:
      if ((0 < (int)local_830._4_4_) && (0 < (int)local_830._8_4_)) {
        fVar23 = 0.0;
        auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
        if (0 < (int)local_830._8_4_) {
          lVar20 = 0;
          lVar18 = 0;
          do {
            if (0 < (int)local_830._4_4_) {
              lVar16 = 0;
              do {
                local_8f8._0_4_ = auVar26._0_4_;
                FVar24 = Image::GetChannel((Image *)local_830,(Point2i)(lVar20 + lVar16),0,
                                           (WrapMode2D)0x200000002);
                auVar26 = ZEXT464((uint)((float)local_8f8._0_4_ + FVar24));
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)local_830._4_4_);
            }
            fVar23 = auVar26._0_4_;
            lVar18 = lVar18 + 1;
            lVar20 = lVar20 + 0x100000000;
          } while (lVar18 < (int)local_830._8_4_);
        }
        if (0 < (int)local_830._8_4_) {
          local_8f8._0_4_ = 0.7853982 / (fVar23 / (float)(int)(local_830._8_4_ * local_830._4_4_));
          lVar20 = 0;
          lVar18 = 0;
          do {
            if (0 < (int)local_830._4_4_) {
              lVar16 = 0;
              do {
                FVar24 = Image::GetChannel((Image *)local_830,(Point2i)(lVar20 + lVar16),0,
                                           (WrapMode2D)0x200000002);
                Image::SetChannel((Image *)local_830,(Point2i)(lVar20 + lVar16),0,
                                  FVar24 * (float)local_8f8._0_4_);
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)local_830._4_4_);
            }
            lVar18 = lVar18 + 1;
            lVar20 = lVar20 + 0x100000000;
          } while (lVar18 < (int)local_830._8_4_);
        }
      }
    }
    iVar8 = (*(local_900.memoryResource)->_vptr_memory_resource[2])
                      (local_900.memoryResource,0x4e8,8);
    p = (RealisticCamera *)CONCAT44(extraout_var,iVar8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    construct<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
              (&local_900,p,&local_380,&local_878,&local_8d0,&local_8cc,(Image *)local_830,
               &local_900);
    local_738.nStored = 0;
    (*(local_738.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_738.alloc.memoryResource,local_738.ptr,local_738.nAlloc << 2,4);
    local_758.nStored = 0;
    (*(local_758.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_758.alloc.memoryResource,local_758.ptr,local_758.nAlloc * 2,2);
    local_778.nStored = 0;
    (*(local_778.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_778.alloc.memoryResource,local_778.ptr,local_778.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
      operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_878.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00354123:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  return p;
}

Assistant:

RealisticCamera *RealisticCamera::Create(const ParameterDictionary &parameters,
                                         const CameraTransform &cameraTransform,
                                         FilmHandle film, MediumHandle medium,
                                         const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    // Realistic camera-specific parameters
    std::string lensFile = ResolveFilename(parameters.GetOneString("lensfile", ""));
    Float apertureDiameter = parameters.GetOneFloat("aperturediameter", 1.0);
    Float focusDistance = parameters.GetOneFloat("focusdistance", 10.0);

    if (lensFile.empty()) {
        Error(loc, "No lens description file supplied!");
        return nullptr;
    }
    // Load element data from lens description file
    std::vector<Float> lensParameters = ReadFloatFile(lensFile);
    if (lensParameters.empty()) {
        Error(loc, "Error reading lens specification file \"%s\".", lensFile);
        return nullptr;
    }
    if (lensParameters.size() % 4 != 0) {
        Error(loc,
              "%s: excess values in lens specification file; "
              "must be multiple-of-four values, read %d.",
              lensFile, (int)lensParameters.size());
        return nullptr;
    }

    int builtinRes = 256;
    auto rasterize = [&](pstd::span<const Point2f> vert) {
        Image image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"}, nullptr, alloc);

        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                Point2f p(-1 + 2 * (x + 0.5f) / image.Resolution().x,
                          -1 + 2 * (y + 0.5f) / image.Resolution().y);
                int windingNumber = 0;
                // Test against edges
                for (int i = 0; i < vert.size(); ++i) {
                    int i1 = (i + 1) % vert.size();
                    Float e = (p[0] - vert[i][0]) * (vert[i1][1] - vert[i][1]) -
                              (p[1] - vert[i][1]) * (vert[i1][0] - vert[i][0]);
                    if (vert[i].y <= p.y) {
                        if (vert[i1].y > p.y && e > 0)
                            ++windingNumber;
                    } else if (vert[i1].y <= p.y && e < 0)
                        --windingNumber;
                }

                image.SetChannel({x, y}, 0, windingNumber == 0 ? 0.f : 1.f);
            }

        return image;
    };

    std::string apertureName = ResolveFilename(parameters.GetOneString("aperture", ""));
    Image apertureImage;
    if (!apertureName.empty()) {
        // built-in diaphragm shapes
        if (apertureName == "gaussian") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x) {
                    Point2f uv(-1 + 2 * (x + 0.5f) / apertureImage.Resolution().x,
                               -1 + 2 * (y + 0.5f) / apertureImage.Resolution().y);
                    Float r2 = Sqr(uv.x) + Sqr(uv.y);
                    Float sigma2 = 1;
                    Float v = std::max<Float>(
                        0, std::exp(-r2 / sigma2) - std::exp(-1 / sigma2));
                    apertureImage.SetChannel({x, y}, 0, v);
                }
        } else if (apertureName == "square") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0, 1.f);
        } else if (apertureName == "pentagon") {
            // https://mathworld.wolfram.com/RegularPentagon.html
            Float c1 = (std::sqrt(5.f) - 1) / 4;
            Float c2 = (std::sqrt(5.f) + 1) / 4;
            Float s1 = std::sqrt(10.f + 2.f * std::sqrt(5.f)) / 4;
            Float s2 = std::sqrt(10.f - 2.f * std::sqrt(5.f)) / 4;
            // Vertices in CW order.
            Point2f vert[5] = {Point2f(0, 1), {s1, c1}, {s2, -c2}, {-s2, -c2}, {-s1, c1}};
            // Scale down slightly
            for (int i = 0; i < 5; ++i)
                vert[i] *= .8f;
            apertureImage = rasterize(vert);
        } else if (apertureName == "star") {
            // 5-sided. Vertices are two pentagons--inner and outer radius
            pstd::array<Point2f, 10> vert;
            for (int i = 0; i < 10; ++i) {
                // inner radius: https://math.stackexchange.com/a/2136996
                Float r =
                    (i & 1) ? 1.f : (std::cos(Radians(72.f)) / std::cos(Radians(36.f)));
                vert[i] = Point2f(r * std::cos(Pi * i / 5.f), r * std::sin(Pi * i / 5.f));
            }
            std::reverse(vert.begin(), vert.end());
            apertureImage = rasterize(vert);
        } else {
            ImageAndMetadata im = Image::Read(apertureName, alloc);
            apertureImage = std::move(im.image);
            if (apertureImage.NChannels() > 1) {
                ImageChannelDesc rgbDesc = apertureImage.GetChannelDesc({"R", "G", "B"});
                if (!rgbDesc)
                    ErrorExit("%s: didn't find R, G, B channels to average for "
                              "aperture image.",
                              apertureName);

                Image mono(PixelFormat::Float, apertureImage.Resolution(), {"Y"}, nullptr,
                           alloc);
                for (int y = 0; y < mono.Resolution().y; ++y)
                    for (int x = 0; x < mono.Resolution().x; ++x) {
                        Float avg = apertureImage.GetChannels({x, y}, rgbDesc).Average();
                        mono.SetChannel({x, y}, 0, avg);
                    }

                apertureImage = std::move(mono);
            }
        }

        if (apertureImage) {
            // Normalize it so that brightness matches a circular aperture
            Float sum = 0;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    sum += apertureImage.GetChannel({x, y}, 0);
            Float avg =
                sum / (apertureImage.Resolution().x * apertureImage.Resolution().y);

            Float scale = (Pi / 4) / avg;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0,
                                             apertureImage.GetChannel({x, y}, 0) * scale);
        }
    }

    return alloc.new_object<RealisticCamera>(cameraBaseParameters, lensParameters,
                                             focusDistance, apertureDiameter,
                                             std::move(apertureImage), alloc);
}